

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::DeleteProperty
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags flags)

{
  BOOL BVar1;
  ES5Array *arr;
  uint32 local_34;
  ScriptContext *pSStack_30;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  scriptContext._0_4_ = flags;
  scriptContext._4_4_ = propertyId;
  _flags_local = instance;
  instance_local = (DynamicObject *)this;
  pSStack_30 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_30,scriptContext._4_4_,&local_34);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DictionaryTypeHandlerBase<int>::DeleteProperty
                   (&this->super_DictionaryTypeHandlerBase<int>,_flags_local,scriptContext._4_4_,
                    (PropertyOperationFlags)scriptContext);
  }
  else {
    arr = VarTo<Js::ES5Array,Js::DynamicObject>(_flags_local);
    this_local._4_4_ =
         DeleteItem(this,arr,_flags_local,local_34,(PropertyOperationFlags)scriptContext);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags flags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return DeleteItem(VarTo<ES5Array>(instance), instance, index, flags);
        }

        return __super::DeleteProperty(instance, propertyId, flags);
    }